

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,bytes *args,unsigned_long *args_1)

{
  handle *this_00;
  unsigned_long *in_RCX;
  PyObject local_30;
  unsigned_long *args_local_1;
  bytes *args_local;
  object_api<pybind11::handle> *this_local;
  
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  collect_arguments<(pybind11::return_value_policy)1,pybind11::bytes,unsigned_long_const&,void>
            ((detail *)&local_30,(bytes *)args_1,in_RCX);
  this_00 = derived((object_api<pybind11::handle> *)args);
  handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,&local_30);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)&local_30);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}